

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.h
# Opt level: O0

RTPPacket * __thiscall jrtplib::RTPSourceData::GetNextPacket(RTPSourceData *this)

{
  bool bVar1;
  reference ppRVar2;
  _List_iterator<jrtplib::RTPPacket_*> local_28;
  RTPSourceData *local_20;
  RTPPacket *p;
  RTPSourceData *this_local;
  
  if ((this->validated & 1U) == 0) {
    this_local = (RTPSourceData *)0x0;
  }
  else {
    p = (RTPPacket *)this;
    bVar1 = std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::empty
                      (&this->packetlist);
    if (bVar1) {
      this_local = (RTPSourceData *)0x0;
    }
    else {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::begin
                     (&this->packetlist);
      ppRVar2 = std::_List_iterator<jrtplib::RTPPacket_*>::operator*(&local_28);
      local_20 = (RTPSourceData *)*ppRVar2;
      std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::pop_front
                (&this->packetlist);
      this_local = local_20;
    }
  }
  return (RTPPacket *)this_local;
}

Assistant:

inline RTPPacket *RTPSourceData::GetNextPacket()
{
	if (!validated)
		return 0;

	RTPPacket *p;

	if (packetlist.empty())
		return 0;
	p = *(packetlist.begin());
	packetlist.pop_front();
	return p;
}